

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)>::
PerformDefaultAction
          (FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *this_00;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> *this_01;
  Result RVar1;
  Result RVar2;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *)0x0) {
    this_01 = OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)>::GetAction(this_00);
    RVar1 = Action<double_(const_char_*,_char_**,___locale_struct_*)>::Perform(this_01,args);
    return RVar1;
  }
  std::operator+(&local_30,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<double>::value_ == (Result *)0x0) {
    RVar2 = 0.0;
  }
  else {
    RVar2 = *DefaultValue<double>::value_;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return RVar2;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }